

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::ProgramInterfaceQueryTestCase::iterate
          (ProgramInterfaceQueryTestCase *this)

{
  ProgramInterface PVar1;
  Context *pCVar2;
  TestContext *pTVar3;
  undefined4 uVar4;
  bool bVar5;
  int iVar6;
  deUint32 dVar7;
  Storage storage_00;
  Program *program_00;
  RenderContext *pRVar8;
  TestLog *pTVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar10;
  size_type sVar11;
  MessageBuilder *pMVar12;
  const_reference pvVar13;
  undefined4 extraout_var;
  TestError *this_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *pcVar14;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  deUint32 local_1b14;
  deUint32 local_1b0c;
  deUint32 local_1b04;
  deUint32 local_1afc;
  ShaderType local_1af4;
  int local_18cc;
  undefined1 local_18c8 [4];
  int propNdx_4;
  vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
  validators_4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> props_4;
  Functions *gl_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1870;
  allocator<char> local_1849;
  string local_1848;
  ScopedLogSection local_1828;
  ScopedLogSection section_5;
  value_type_conflict2 local_1818;
  int targetResourceNdx_4;
  TestProperty allProperties_4 [3];
  undefined1 local_17e0 [8];
  TransformFeedbackNameLengthValidator nameLengthValidator_4;
  TransformFeedbackArraySizeValidator arraySizeValidator_3;
  TransformFeedbackTypeValidator typeValidator_3;
  undefined1 local_1748 [4];
  int propNdx_3;
  vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
  validators_3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> props_3;
  Functions *gl_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_16f0;
  allocator<char> local_16c9;
  string local_16c8;
  ScopedLogSection local_16a8;
  ScopedLogSection section_4;
  value_type_conflict2 local_1698;
  int targetResourceNdx_3;
  TestProperty allProperties_3 [16];
  TopLevelArrayStrideValidator topLevelArrayStrideValidator;
  TopLevelArraySizeValidator topLevelArraySizeValidator;
  VariableReferencedByShaderValidator referencedByTessEvaluationVerifier_3;
  VariableReferencedByShaderValidator referencedByTessControlVerifier_3;
  VariableReferencedByShaderValidator referencedByGeometryVerifier_3;
  VariableReferencedByShaderValidator referencedByComputeVerifier_3;
  VariableReferencedByShaderValidator referencedByFragmentVerifier_3;
  VariableReferencedByShaderValidator referencedByVertexVerifier_3;
  VariableNameLengthValidator nameLengthValidator_3;
  OffsetValidator offsetValidator;
  MatrixStrideValidator matrixStrideValidator_1;
  IsRowMajorValidator isRowMajorValidator_1;
  BlockIndexValidator blockIndexValidator_1;
  ArrayStrideValidator arrayStrideValidator_1;
  ArraySizeValidator arraySizeValidator_2;
  TypeValidator typeValidator_2;
  VariableSearchFilter variableFilter_1;
  int propNdx_2;
  vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
  validators_2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> props_2;
  Functions *gl_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1188;
  allocator<char> local_1161;
  string local_1160;
  ScopedLogSection local_1140;
  ScopedLogSection section_3;
  undefined1 local_1130 [8];
  string resourceInterfaceName;
  value_type_conflict2 local_1108;
  int targetResourceNdx_2;
  TestProperty allProperties_2 [11];
  PerPatchValidator perPatchValidator;
  VariableReferencedByShaderValidator referencedByTessEvaluationVerifier_2;
  VariableReferencedByShaderValidator referencedByTessControlVerifier_2;
  VariableReferencedByShaderValidator referencedByGeometryVerifier_2;
  VariableReferencedByShaderValidator referencedByComputeVerifier_2;
  VariableReferencedByShaderValidator referencedByFragmentVerifier_2;
  VariableReferencedByShaderValidator referencedByVertexVerifier_2;
  VariableNameLengthValidator nameLengthValidator_2;
  LocationValidator locationValidator_1;
  ArraySizeValidator arraySizeValidator_1;
  TypeValidator typeValidator_1;
  VariableSearchFilter local_de0;
  VariableSearchFilter local_dd8;
  VariableSearchFilter local_dd0;
  VariableSearchFilter local_dc8;
  VariableSearchFilter variableFilter;
  int unsizedArraySize;
  ShaderType shaderType;
  Storage patchStorage;
  Storage varyingStorage;
  undefined1 local_da8 [3];
  bool isInputCase;
  int propNdx_1;
  vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
  validators_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> props_1;
  Functions *gl_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d50;
  allocator<char> local_d29;
  string local_d28;
  ScopedLogSection local_d08;
  ScopedLogSection section_2;
  value_type_conflict2 local_cf8;
  int targetResourceNdx_1;
  TestProperty allProperties_1 [8];
  BufferBindingValidator bufferBindingValidator;
  BlockReferencedByShaderValidator referencedByTessEvaluationVerifier_1;
  BlockReferencedByShaderValidator referencedByTessControlVerifier_1;
  BlockReferencedByShaderValidator referencedByGeometryVerifier_1;
  BlockReferencedByShaderValidator referencedByComputeVerifier_1;
  BlockReferencedByShaderValidator referencedByFragmentVerifier_1;
  BlockReferencedByShaderValidator referencedByVertexVerifier_1;
  BlockNameLengthValidator nameLengthValidator_1;
  VariableSearchFilter blockFilter;
  Storage storage;
  int propNdx;
  vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
  validators;
  vector<unsigned_int,_std::allocator<unsigned_int>_> props;
  Functions *gl;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a50;
  allocator<char> local_a29;
  string local_a28;
  ScopedLogSection local_a08;
  ScopedLogSection section_1;
  value_type_conflict2 local_9f8;
  int targetResourceNdx;
  TestProperty allProperties [16];
  VariableReferencedByShaderValidator referencedByTessEvaluationVerifier;
  VariableReferencedByShaderValidator referencedByTessControlVerifier;
  VariableReferencedByShaderValidator referencedByGeometryVerifier;
  VariableReferencedByShaderValidator referencedByComputeVerifier;
  VariableReferencedByShaderValidator referencedByFragmentVerifier;
  VariableReferencedByShaderValidator referencedByVertexVerifier;
  OffsetValidator offsetVerifier;
  VariableNameLengthValidator nameLengthValidator;
  LocationValidator locationValidator;
  AtomicCounterBufferIndexVerifier atomicCounterBufferIndexVerifier;
  MatrixStrideValidator matrixStrideValidator;
  IsRowMajorValidator isRowMajorValidator;
  BlockIndexValidator blockIndexValidator;
  ArrayStrideValidator arrayStrideValidator;
  ArraySizeValidator arraySizeValidator;
  TypeValidator typeValidator;
  VariableSearchFilter uniformFilter;
  MessageBuilder local_540;
  int local_3bc;
  undefined1 local_3b8 [4];
  int ndx;
  MessageBuilder builder;
  string local_230;
  allocator<char> local_209;
  string local_208;
  ScopedLogSection local_1e8;
  ScopedLogSection section;
  undefined1 local_100 [8];
  ShaderProgram program;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  targetResources;
  Program *programDefinition;
  ProgramInterfaceQueryTestCase *this_local;
  
  program_00 = getAndCheckProgramDefinition(this);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
            (&program.m_program.m_info.linkTimeUs);
  pRVar8 = Context::getRenderContext((this->super_TestCase).m_context);
  generateProgramInterfaceProgramSources((ProgramSources *)&section,program_00);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_100,pRVar8,(ProgramSources *)&section);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&section);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  pTVar9 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"Program",&local_209);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,"Program",(allocator<char> *)&builder.field_0x17f);
  tcu::ScopedLogSection::ScopedLogSection(&local_1e8,pTVar9,&local_208,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator((allocator<char> *)&builder.field_0x17f);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator(&local_209);
  pvVar10 = ProgramInterfaceDefinition::Program::getTransformFeedbackVaryings_abi_cxx11_(program_00)
  ;
  bVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(pvVar10);
  if (!bVar5) {
    pTVar9 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::MessageBuilder::MessageBuilder((MessageBuilder *)local_3b8,pTVar9);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_3b8,(char (*) [31])"Transform feedback varyings: {");
    local_3bc = 0;
    while( true ) {
      iVar6 = local_3bc;
      pvVar10 = ProgramInterfaceDefinition::Program::getTransformFeedbackVaryings_abi_cxx11_
                          (program_00);
      sVar11 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(pvVar10);
      if ((int)sVar11 <= iVar6) break;
      if (local_3bc != 0) {
        tcu::MessageBuilder::operator<<((MessageBuilder *)local_3b8,(char (*) [3])0xf95514);
      }
      pMVar12 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_3b8,(char (*) [2])0xf09e4c);
      pvVar10 = ProgramInterfaceDefinition::Program::getTransformFeedbackVaryings_abi_cxx11_
                          (program_00);
      pvVar13 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](pvVar10,(long)local_3bc);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,pvVar13);
      tcu::MessageBuilder::operator<<(pMVar12,(char (*) [2])0xf09e4c);
      local_3bc = local_3bc + 1;
    }
    pMVar12 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_3b8,(char (*) [2])0xf26f8f);
    tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_3b8);
  }
  pTVar9 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::operator<<(pTVar9,(ShaderProgram *)local_100);
  bVar5 = glu::ShaderProgram::isOk((ShaderProgram *)local_100);
  if (bVar5) {
    tcu::ScopedLogSection::~ScopedLogSection(&local_1e8);
    switch((this->m_queryTarget).interface) {
    case PROGRAMINTERFACE_UNIFORM:
      register0x00000000 =
           ProgramInterfaceDefinition::VariableSearchFilter::createStorageFilter(STORAGE_UNIFORM);
      pCVar2 = (this->super_TestCase).m_context;
      dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_100);
      anon_unknown_0::TypeValidator::TypeValidator
                ((TypeValidator *)&arraySizeValidator.m_unsizedArraySize,pCVar2,dVar7,
                 (VariableSearchFilter *)&typeValidator.super_SingleVariableValidator.m_programID);
      pCVar2 = (this->super_TestCase).m_context;
      dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_100);
      anon_unknown_0::ArraySizeValidator::ArraySizeValidator
                ((ArraySizeValidator *)
                 &arrayStrideValidator.super_SingleVariableValidator.field_0x30,pCVar2,dVar7,-1,
                 (VariableSearchFilter *)&typeValidator.super_SingleVariableValidator.m_programID);
      pCVar2 = (this->super_TestCase).m_context;
      dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_100);
      anon_unknown_0::ArrayStrideValidator::ArrayStrideValidator
                ((ArrayStrideValidator *)
                 &blockIndexValidator.super_SingleVariableValidator.field_0x30,pCVar2,dVar7,
                 (VariableSearchFilter *)&typeValidator.super_SingleVariableValidator.m_programID);
      pCVar2 = (this->super_TestCase).m_context;
      dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_100);
      anon_unknown_0::BlockIndexValidator::BlockIndexValidator
                ((BlockIndexValidator *)
                 &isRowMajorValidator.super_SingleVariableValidator.field_0x30,pCVar2,dVar7,
                 (VariableSearchFilter *)&typeValidator.super_SingleVariableValidator.m_programID);
      pCVar2 = (this->super_TestCase).m_context;
      dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_100);
      anon_unknown_0::IsRowMajorValidator::IsRowMajorValidator
                ((IsRowMajorValidator *)
                 &matrixStrideValidator.super_SingleVariableValidator.field_0x30,pCVar2,dVar7,
                 (VariableSearchFilter *)&typeValidator.super_SingleVariableValidator.m_programID);
      pCVar2 = (this->super_TestCase).m_context;
      dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_100);
      anon_unknown_0::MatrixStrideValidator::MatrixStrideValidator
                ((MatrixStrideValidator *)
                 &atomicCounterBufferIndexVerifier.super_SingleVariableValidator.field_0x30,pCVar2,
                 dVar7,(VariableSearchFilter *)
                       &typeValidator.super_SingleVariableValidator.m_programID);
      pCVar2 = (this->super_TestCase).m_context;
      dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_100);
      anon_unknown_0::AtomicCounterBufferIndexVerifier::AtomicCounterBufferIndexVerifier
                ((AtomicCounterBufferIndexVerifier *)
                 &locationValidator.super_SingleVariableValidator.field_0x30,pCVar2,dVar7,
                 (VariableSearchFilter *)&typeValidator.super_SingleVariableValidator.m_programID);
      pCVar2 = (this->super_TestCase).m_context;
      dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_100);
      anon_unknown_0::LocationValidator::LocationValidator
                ((LocationValidator *)&nameLengthValidator.super_SingleVariableValidator.field_0x30,
                 pCVar2,dVar7,
                 (VariableSearchFilter *)&typeValidator.super_SingleVariableValidator.m_programID);
      pCVar2 = (this->super_TestCase).m_context;
      dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_100);
      anon_unknown_0::VariableNameLengthValidator::VariableNameLengthValidator
                ((VariableNameLengthValidator *)
                 &offsetVerifier.super_SingleVariableValidator.field_0x30,pCVar2,dVar7,
                 (VariableSearchFilter *)&typeValidator.super_SingleVariableValidator.m_programID);
      pCVar2 = (this->super_TestCase).m_context;
      dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_100);
      anon_unknown_0::OffsetValidator::OffsetValidator
                ((OffsetValidator *)&referencedByVertexVerifier.field_0x30,pCVar2,dVar7,
                 (VariableSearchFilter *)&typeValidator.super_SingleVariableValidator.m_programID);
      anon_unknown_0::VariableReferencedByShaderValidator::VariableReferencedByShaderValidator
                ((VariableReferencedByShaderValidator *)&referencedByFragmentVerifier.field_0x30,
                 (this->super_TestCase).m_context,SHADERTYPE_VERTEX,
                 (VariableSearchFilter *)&typeValidator.super_SingleVariableValidator.m_programID);
      anon_unknown_0::VariableReferencedByShaderValidator::VariableReferencedByShaderValidator
                ((VariableReferencedByShaderValidator *)&referencedByComputeVerifier.field_0x30,
                 (this->super_TestCase).m_context,SHADERTYPE_FRAGMENT,
                 (VariableSearchFilter *)&typeValidator.super_SingleVariableValidator.m_programID);
      anon_unknown_0::VariableReferencedByShaderValidator::VariableReferencedByShaderValidator
                ((VariableReferencedByShaderValidator *)&referencedByGeometryVerifier.field_0x30,
                 (this->super_TestCase).m_context,SHADERTYPE_COMPUTE,
                 (VariableSearchFilter *)&typeValidator.super_SingleVariableValidator.m_programID);
      anon_unknown_0::VariableReferencedByShaderValidator::VariableReferencedByShaderValidator
                ((VariableReferencedByShaderValidator *)&referencedByTessControlVerifier.field_0x30,
                 (this->super_TestCase).m_context,SHADERTYPE_GEOMETRY,
                 (VariableSearchFilter *)&typeValidator.super_SingleVariableValidator.m_programID);
      anon_unknown_0::VariableReferencedByShaderValidator::VariableReferencedByShaderValidator
                ((VariableReferencedByShaderValidator *)
                 &referencedByTessEvaluationVerifier.field_0x30,(this->super_TestCase).m_context,
                 SHADERTYPE_TESSELLATION_CONTROL,
                 (VariableSearchFilter *)&typeValidator.super_SingleVariableValidator.m_programID);
      anon_unknown_0::VariableReferencedByShaderValidator::VariableReferencedByShaderValidator
                ((VariableReferencedByShaderValidator *)&allProperties[0xf].validator,
                 (this->super_TestCase).m_context,SHADERTYPE_TESSELLATION_EVALUATION,
                 (VariableSearchFilter *)&typeValidator.super_SingleVariableValidator.m_programID);
      local_9f8 = 0x92fb;
      allProperties[0]._0_8_ = &arrayStrideValidator.super_SingleVariableValidator.field_0x30;
      allProperties[0].validator._0_4_ = 0x92fe;
      allProperties[1]._0_8_ = &blockIndexValidator.super_SingleVariableValidator.field_0x30;
      allProperties[1].validator._0_4_ = 0x9301;
      allProperties[2]._0_8_ = &locationValidator.super_SingleVariableValidator.field_0x30;
      allProperties[2].validator._0_4_ = 0x92fd;
      allProperties[3]._0_8_ = &isRowMajorValidator.super_SingleVariableValidator.field_0x30;
      allProperties[3].validator._0_4_ = 0x9300;
      allProperties[4]._0_8_ = &matrixStrideValidator.super_SingleVariableValidator.field_0x30;
      allProperties[4].validator._0_4_ = 0x930e;
      allProperties[5]._0_8_ = &nameLengthValidator.super_SingleVariableValidator.field_0x30;
      allProperties[5].validator._0_4_ = 0x92ff;
      allProperties[6]._0_8_ =
           &atomicCounterBufferIndexVerifier.super_SingleVariableValidator.field_0x30;
      allProperties[6].validator._0_4_ = 0x92f9;
      allProperties[7]._0_8_ = &offsetVerifier.super_SingleVariableValidator.field_0x30;
      allProperties[7].validator._0_4_ = 0x92fc;
      allProperties[8]._0_8_ = &referencedByVertexVerifier.field_0x30;
      allProperties[8].validator._0_4_ = 0x9306;
      allProperties[9]._0_8_ = &referencedByFragmentVerifier.field_0x30;
      allProperties[9].validator._0_4_ = 0x930a;
      allProperties[10]._0_8_ = &referencedByComputeVerifier.field_0x30;
      allProperties[10].validator._0_4_ = 0x930b;
      allProperties[0xb]._0_8_ = &referencedByGeometryVerifier.field_0x30;
      allProperties[0xb].validator._0_4_ = 0x9309;
      allProperties[0xc]._0_8_ = &referencedByTessControlVerifier.field_0x30;
      allProperties[0xc].validator._0_4_ = 0x9307;
      allProperties[0xd]._0_8_ = &referencedByTessEvaluationVerifier.field_0x30;
      allProperties[0xd].validator._0_4_ = 0x9308;
      allProperties[0xe]._0_8_ = &allProperties[0xf].validator;
      allProperties[0xe].validator._0_4_ = 0x92fa;
      allProperties[0xf]._0_8_ = &arraySizeValidator.m_unsizedArraySize;
      for (section_1.m_log._4_4_ = 0; iVar6 = section_1.m_log._4_4_,
          sVar11 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&program.m_program.m_info.linkTimeUs), iVar6 < (int)sVar11;
          section_1.m_log._4_4_ = section_1.m_log._4_4_ + 1) {
        pTVar9 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a28,"UniformResource",&local_a29);
        pvVar13 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&program.m_program.m_info.linkTimeUs,(long)section_1.m_log._4_4_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gl,
                       "Uniform resource \"",pvVar13);
        std::operator+(&local_a50,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gl,"\""
                      );
        tcu::ScopedLogSection::ScopedLogSection(&local_a08,pTVar9,&local_a28,&local_a50);
        std::__cxx11::string::~string((string *)&local_a50);
        std::__cxx11::string::~string((string *)&gl);
        std::__cxx11::string::~string((string *)&local_a28);
        std::allocator<char>::~allocator(&local_a29);
        pRVar8 = Context::getRenderContext((this->super_TestCase).m_context);
        iVar6 = (*pRVar8->_vptr_RenderContext[3])();
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &validators.
                    super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
        ::vector((vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                  *)&storage);
        for (blockFilter.m_storageBits = 0; (int)blockFilter.m_storageBits < 0x10;
            blockFilter.m_storageBits = blockFilter.m_storageBits + 1) {
          bVar5 = anon_unknown_0::PropValidator::isSelected
                            (*(PropValidator **)(allProperties + (int)blockFilter.m_storageBits),
                             (this->m_queryTarget).propFlags);
          if ((bVar5) &&
             (bVar5 = anon_unknown_0::PropValidator::isSupported
                                (*(PropValidator **)(allProperties + (int)blockFilter.m_storageBits)
                                ), bVar5)) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       &validators.
                        super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       &local_9f8 + (long)(int)blockFilter.m_storageBits * 4);
            std::
            vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
            ::push_back((vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                         *)&storage,(value_type *)(allProperties + (int)blockFilter.m_storageBits));
          }
        }
        pTVar3 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
        dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_100);
        PVar1 = (this->m_queryTarget).interface;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&program.m_program.m_info.linkTimeUs,(long)section_1.m_log._4_4_);
        pcVar14 = (char *)std::__cxx11::string::c_str();
        queryAndValidateProps
                  (pTVar3,(Functions *)CONCAT44(extraout_var_00,iVar6),dVar7,PVar1,pcVar14,
                   program_00,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &validators.
                    super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                    *)&storage);
        std::
        vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
        ::~vector((vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                   *)&storage);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &validators.
                    super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        tcu::ScopedLogSection::~ScopedLogSection(&local_a08);
      }
      break;
    case PROGRAMINTERFACE_UNIFORM_BLOCK:
    case PROGRAMINTERFACE_SHADER_STORAGE_BLOCK:
      nameLengthValidator_1.super_SingleBlockValidator._48_8_ =
           ProgramInterfaceDefinition::VariableSearchFilter::createStorageFilter
                     (((this->m_queryTarget).interface != PROGRAMINTERFACE_UNIFORM_BLOCK) +
                      STORAGE_UNIFORM);
      pCVar2 = (this->super_TestCase).m_context;
      dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_100);
      anon_unknown_0::BlockNameLengthValidator::BlockNameLengthValidator
                ((BlockNameLengthValidator *)&referencedByVertexVerifier_1.field_0x30,pCVar2,dVar7,
                 (VariableSearchFilter *)
                 &nameLengthValidator_1.super_SingleBlockValidator.field_0x30);
      anon_unknown_0::BlockReferencedByShaderValidator::BlockReferencedByShaderValidator
                ((BlockReferencedByShaderValidator *)&referencedByFragmentVerifier_1.field_0x30,
                 (this->super_TestCase).m_context,SHADERTYPE_VERTEX,
                 (VariableSearchFilter *)
                 &nameLengthValidator_1.super_SingleBlockValidator.field_0x30);
      anon_unknown_0::BlockReferencedByShaderValidator::BlockReferencedByShaderValidator
                ((BlockReferencedByShaderValidator *)&referencedByComputeVerifier_1.field_0x30,
                 (this->super_TestCase).m_context,SHADERTYPE_FRAGMENT,
                 (VariableSearchFilter *)
                 &nameLengthValidator_1.super_SingleBlockValidator.field_0x30);
      anon_unknown_0::BlockReferencedByShaderValidator::BlockReferencedByShaderValidator
                ((BlockReferencedByShaderValidator *)&referencedByGeometryVerifier_1.field_0x30,
                 (this->super_TestCase).m_context,SHADERTYPE_COMPUTE,
                 (VariableSearchFilter *)
                 &nameLengthValidator_1.super_SingleBlockValidator.field_0x30);
      anon_unknown_0::BlockReferencedByShaderValidator::BlockReferencedByShaderValidator
                ((BlockReferencedByShaderValidator *)&referencedByTessControlVerifier_1.field_0x30,
                 (this->super_TestCase).m_context,SHADERTYPE_GEOMETRY,
                 (VariableSearchFilter *)
                 &nameLengthValidator_1.super_SingleBlockValidator.field_0x30);
      anon_unknown_0::BlockReferencedByShaderValidator::BlockReferencedByShaderValidator
                ((BlockReferencedByShaderValidator *)
                 &referencedByTessEvaluationVerifier_1.field_0x30,(this->super_TestCase).m_context,
                 SHADERTYPE_TESSELLATION_CONTROL,
                 (VariableSearchFilter *)
                 &nameLengthValidator_1.super_SingleBlockValidator.field_0x30);
      anon_unknown_0::BlockReferencedByShaderValidator::BlockReferencedByShaderValidator
                ((BlockReferencedByShaderValidator *)
                 &bufferBindingValidator.super_SingleBlockValidator.field_0x30,
                 (this->super_TestCase).m_context,SHADERTYPE_TESSELLATION_EVALUATION,
                 (VariableSearchFilter *)
                 &nameLengthValidator_1.super_SingleBlockValidator.field_0x30);
      pCVar2 = (this->super_TestCase).m_context;
      dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_100);
      anon_unknown_0::BufferBindingValidator::BufferBindingValidator
                ((BufferBindingValidator *)&allProperties_1[7].validator,pCVar2,dVar7,
                 (VariableSearchFilter *)
                 &nameLengthValidator_1.super_SingleBlockValidator.field_0x30);
      local_cf8 = 0x92f9;
      allProperties_1[0]._0_8_ = &referencedByVertexVerifier_1.field_0x30;
      allProperties_1[0].validator._0_4_ = 0x9306;
      allProperties_1[1]._0_8_ = &referencedByFragmentVerifier_1.field_0x30;
      allProperties_1[1].validator._0_4_ = 0x930a;
      allProperties_1[2]._0_8_ = &referencedByComputeVerifier_1.field_0x30;
      allProperties_1[2].validator._0_4_ = 0x930b;
      allProperties_1[3]._0_8_ = &referencedByGeometryVerifier_1.field_0x30;
      allProperties_1[3].validator._0_4_ = 0x9309;
      allProperties_1[4]._0_8_ = &referencedByTessControlVerifier_1.field_0x30;
      allProperties_1[4].validator._0_4_ = 0x9307;
      allProperties_1[5]._0_8_ = &referencedByTessEvaluationVerifier_1.field_0x30;
      allProperties_1[5].validator._0_4_ = 0x9308;
      allProperties_1[6]._0_8_ = &bufferBindingValidator.super_SingleBlockValidator.field_0x30;
      allProperties_1[6].validator._0_4_ = 0x9302;
      allProperties_1[7]._0_8_ = &allProperties_1[7].validator;
      for (section_2.m_log._4_4_ = 0; iVar6 = section_2.m_log._4_4_,
          sVar11 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&program.m_program.m_info.linkTimeUs), iVar6 < (int)sVar11;
          section_2.m_log._4_4_ = section_2.m_log._4_4_ + 1) {
        pTVar9 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d28,"BlockResource",&local_d29);
        pvVar13 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&program.m_program.m_info.linkTimeUs,(long)section_2.m_log._4_4_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gl_1,
                       "Interface block \"",pvVar13);
        std::operator+(&local_d50,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gl_1,
                       "\"");
        tcu::ScopedLogSection::ScopedLogSection(&local_d08,pTVar9,&local_d28,&local_d50);
        std::__cxx11::string::~string((string *)&local_d50);
        std::__cxx11::string::~string((string *)&gl_1);
        std::__cxx11::string::~string((string *)&local_d28);
        std::allocator<char>::~allocator(&local_d29);
        pRVar8 = Context::getRenderContext((this->super_TestCase).m_context);
        iVar6 = (*pRVar8->_vptr_RenderContext[3])();
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &validators_1.
                    super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
        ::vector((vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                  *)local_da8);
        for (varyingStorage = STORAGE_IN; (int)varyingStorage < 8;
            varyingStorage = varyingStorage + STORAGE_OUT) {
          bVar5 = anon_unknown_0::PropValidator::isSelected
                            (*(PropValidator **)(allProperties_1 + (int)varyingStorage),
                             (this->m_queryTarget).propFlags);
          if ((bVar5) &&
             (bVar5 = anon_unknown_0::PropValidator::isSupported
                                (*(PropValidator **)(allProperties_1 + (int)varyingStorage)), bVar5)
             ) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       &validators_1.
                        super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       &local_cf8 + (long)(int)varyingStorage * 4);
            std::
            vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
            ::push_back((vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                         *)local_da8,(value_type *)(allProperties_1 + (int)varyingStorage));
          }
        }
        pTVar3 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
        dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_100);
        PVar1 = (this->m_queryTarget).interface;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&program.m_program.m_info.linkTimeUs,(long)section_2.m_log._4_4_);
        pcVar14 = (char *)std::__cxx11::string::c_str();
        queryAndValidateProps
                  (pTVar3,(Functions *)CONCAT44(extraout_var_01,iVar6),dVar7,PVar1,pcVar14,
                   program_00,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &validators_1.
                    super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                    *)local_da8);
        std::
        vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
        ::~vector((vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                   *)local_da8);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &validators_1.
                    super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        tcu::ScopedLogSection::~ScopedLogSection(&local_d08);
      }
      break;
    default:
      break;
    case PROGRAMINTERFACE_PROGRAM_INPUT:
    case PROGRAMINTERFACE_PROGRAM_OUTPUT:
      bVar5 = (this->m_queryTarget).interface == PROGRAMINTERFACE_PROGRAM_INPUT;
      storage_00 = STORAGE_PATCH_OUT;
      if (bVar5) {
        storage_00 = STORAGE_PATCH_IN;
        local_1af4 = ProgramInterfaceDefinition::Program::getFirstStage(program_00);
      }
      else {
        local_1af4 = ProgramInterfaceDefinition::Program::getLastStage(program_00);
      }
      variableFilter.m_storageBits = local_1af4;
      if ((bVar5) && (local_1af4 == SHADERTYPE_GEOMETRY)) {
        local_1afc = 1;
      }
      else {
        if ((bVar5) && (local_1af4 == SHADERTYPE_TESSELLATION_CONTROL)) {
          local_1b04 = getMaxPatchVertices(this);
        }
        else {
          if ((bVar5) || (local_1af4 != SHADERTYPE_TESSELLATION_CONTROL)) {
            if ((bVar5) && (local_1af4 == SHADERTYPE_TESSELLATION_EVALUATION)) {
              local_1b14 = getMaxPatchVertices(this);
            }
            else {
              local_1b14 = 0xffffffff;
            }
            local_1b0c = local_1b14;
          }
          else {
            local_1b0c = ProgramInterfaceDefinition::Program::getTessellationNumOutputPatchVertices
                                   (program_00);
          }
          local_1b04 = local_1b0c;
        }
        local_1afc = local_1b04;
      }
      variableFilter.m_shaderTypeBits = local_1afc;
      local_dd0 = ProgramInterfaceDefinition::VariableSearchFilter::createShaderTypeFilter
                            (variableFilter.m_storageBits);
      local_de0 = ProgramInterfaceDefinition::VariableSearchFilter::createStorageFilter
                            ((uint)!bVar5);
      typeValidator_1.super_SingleVariableValidator._48_8_ =
           ProgramInterfaceDefinition::VariableSearchFilter::createStorageFilter(storage_00);
      local_dd8 = ProgramInterfaceDefinition::VariableSearchFilter::logicalOr
                            (&local_de0,
                             (VariableSearchFilter *)
                             &typeValidator_1.super_SingleVariableValidator.field_0x30);
      local_dc8 = ProgramInterfaceDefinition::VariableSearchFilter::logicalAnd
                            (&local_dd0,&local_dd8);
      pCVar2 = (this->super_TestCase).m_context;
      dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_100);
      anon_unknown_0::TypeValidator::TypeValidator
                ((TypeValidator *)&arraySizeValidator_1.m_unsizedArraySize,pCVar2,dVar7,&local_dc8);
      pCVar2 = (this->super_TestCase).m_context;
      dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_100);
      anon_unknown_0::ArraySizeValidator::ArraySizeValidator
                ((ArraySizeValidator *)&locationValidator_1.super_SingleVariableValidator.field_0x30
                 ,pCVar2,dVar7,variableFilter.m_shaderTypeBits,&local_dc8);
      pCVar2 = (this->super_TestCase).m_context;
      dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_100);
      anon_unknown_0::LocationValidator::LocationValidator
                ((LocationValidator *)
                 &nameLengthValidator_2.super_SingleVariableValidator.field_0x30,pCVar2,dVar7,
                 &local_dc8);
      pCVar2 = (this->super_TestCase).m_context;
      dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_100);
      anon_unknown_0::VariableNameLengthValidator::VariableNameLengthValidator
                ((VariableNameLengthValidator *)&referencedByVertexVerifier_2.field_0x30,pCVar2,
                 dVar7,&local_dc8);
      anon_unknown_0::VariableReferencedByShaderValidator::VariableReferencedByShaderValidator
                ((VariableReferencedByShaderValidator *)&referencedByFragmentVerifier_2.field_0x30,
                 (this->super_TestCase).m_context,SHADERTYPE_VERTEX,&local_dc8);
      anon_unknown_0::VariableReferencedByShaderValidator::VariableReferencedByShaderValidator
                ((VariableReferencedByShaderValidator *)&referencedByComputeVerifier_2.field_0x30,
                 (this->super_TestCase).m_context,SHADERTYPE_FRAGMENT,&local_dc8);
      anon_unknown_0::VariableReferencedByShaderValidator::VariableReferencedByShaderValidator
                ((VariableReferencedByShaderValidator *)&referencedByGeometryVerifier_2.field_0x30,
                 (this->super_TestCase).m_context,SHADERTYPE_COMPUTE,&local_dc8);
      anon_unknown_0::VariableReferencedByShaderValidator::VariableReferencedByShaderValidator
                ((VariableReferencedByShaderValidator *)
                 &referencedByTessControlVerifier_2.field_0x30,(this->super_TestCase).m_context,
                 SHADERTYPE_GEOMETRY,&local_dc8);
      anon_unknown_0::VariableReferencedByShaderValidator::VariableReferencedByShaderValidator
                ((VariableReferencedByShaderValidator *)
                 &referencedByTessEvaluationVerifier_2.field_0x30,(this->super_TestCase).m_context,
                 SHADERTYPE_TESSELLATION_CONTROL,&local_dc8);
      anon_unknown_0::VariableReferencedByShaderValidator::VariableReferencedByShaderValidator
                ((VariableReferencedByShaderValidator *)
                 &perPatchValidator.super_SingleVariableValidator.field_0x30,
                 (this->super_TestCase).m_context,SHADERTYPE_TESSELLATION_EVALUATION,&local_dc8);
      pCVar2 = (this->super_TestCase).m_context;
      dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_100);
      anon_unknown_0::PerPatchValidator::PerPatchValidator
                ((PerPatchValidator *)&allProperties_2[10].validator,pCVar2,dVar7,&local_dc8);
      local_1108 = 0x92fb;
      allProperties_2[0]._0_8_ = &locationValidator_1.super_SingleVariableValidator.field_0x30;
      allProperties_2[0].validator._0_4_ = 0x930e;
      allProperties_2[1]._0_8_ = &nameLengthValidator_2.super_SingleVariableValidator.field_0x30;
      allProperties_2[1].validator._0_4_ = 0x92f9;
      allProperties_2[2]._0_8_ = &referencedByVertexVerifier_2.field_0x30;
      allProperties_2[2].validator._0_4_ = 0x9306;
      allProperties_2[3]._0_8_ = &referencedByFragmentVerifier_2.field_0x30;
      allProperties_2[3].validator._0_4_ = 0x930a;
      allProperties_2[4]._0_8_ = &referencedByComputeVerifier_2.field_0x30;
      allProperties_2[4].validator._0_4_ = 0x930b;
      allProperties_2[5]._0_8_ = &referencedByGeometryVerifier_2.field_0x30;
      allProperties_2[5].validator._0_4_ = 0x9309;
      allProperties_2[6]._0_8_ = &referencedByTessControlVerifier_2.field_0x30;
      allProperties_2[6].validator._0_4_ = 0x9307;
      allProperties_2[7]._0_8_ = &referencedByTessEvaluationVerifier_2.field_0x30;
      allProperties_2[7].validator._0_4_ = 0x9308;
      allProperties_2[8]._0_8_ = &perPatchValidator.super_SingleVariableValidator.field_0x30;
      allProperties_2[8].validator._0_4_ = 0x92fa;
      allProperties_2[9]._0_8_ = &arraySizeValidator_1.m_unsizedArraySize;
      allProperties_2[9].validator._0_4_ = 0x92e7;
      allProperties_2[10]._0_8_ = &allProperties_2[10].validator;
      for (resourceInterfaceName.field_2._12_4_ = 0; uVar4 = resourceInterfaceName.field_2._12_4_,
          sVar11 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&program.m_program.m_info.linkTimeUs), (int)uVar4 < (int)sVar11;
          resourceInterfaceName.field_2._12_4_ = resourceInterfaceName.field_2._12_4_ + 1) {
        pcVar14 = "Output";
        if ((this->m_queryTarget).interface == PROGRAMINTERFACE_PROGRAM_INPUT) {
          pcVar14 = "Input";
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1130,pcVar14,(allocator<char> *)((long)&section_3.m_log + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&section_3.m_log + 7));
        pTVar9 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1160,"BlockResource",&local_1161);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gl_2,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1130," resource \"");
        pvVar13 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&program.m_program.m_info.linkTimeUs,
                               (long)(int)resourceInterfaceName.field_2._12_4_);
        std::operator+(&local_11a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gl_2,
                       pvVar13);
        std::operator+(&local_1188,&local_11a8,"\"");
        tcu::ScopedLogSection::ScopedLogSection(&local_1140,pTVar9,&local_1160,&local_1188);
        std::__cxx11::string::~string((string *)&local_1188);
        std::__cxx11::string::~string((string *)&local_11a8);
        std::__cxx11::string::~string((string *)&gl_2);
        std::__cxx11::string::~string((string *)&local_1160);
        std::allocator<char>::~allocator(&local_1161);
        pRVar8 = Context::getRenderContext((this->super_TestCase).m_context);
        iVar6 = (*pRVar8->_vptr_RenderContext[3])();
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &validators_2.
                    super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
        ::vector((vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                  *)&variableFilter_1.m_storageBits);
        for (variableFilter_1.m_shaderTypeBits = 0; (int)variableFilter_1.m_shaderTypeBits < 0xb;
            variableFilter_1.m_shaderTypeBits = variableFilter_1.m_shaderTypeBits + 1) {
          bVar5 = anon_unknown_0::PropValidator::isSelected
                            (*(PropValidator **)
                              (allProperties_2 + (int)variableFilter_1.m_shaderTypeBits),
                             (this->m_queryTarget).propFlags);
          if ((bVar5) &&
             (bVar5 = anon_unknown_0::PropValidator::isSupported
                                (*(PropValidator **)
                                  (allProperties_2 + (int)variableFilter_1.m_shaderTypeBits)), bVar5
             )) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       &validators_2.
                        super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       &local_1108 + (long)(int)variableFilter_1.m_shaderTypeBits * 4);
            std::
            vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
            ::push_back((vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                         *)&variableFilter_1.m_storageBits,
                        (value_type *)(allProperties_2 + (int)variableFilter_1.m_shaderTypeBits));
          }
        }
        pTVar3 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
        dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_100);
        PVar1 = (this->m_queryTarget).interface;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&program.m_program.m_info.linkTimeUs,
                     (long)(int)resourceInterfaceName.field_2._12_4_);
        pcVar14 = (char *)std::__cxx11::string::c_str();
        queryAndValidateProps
                  (pTVar3,(Functions *)CONCAT44(extraout_var_02,iVar6),dVar7,PVar1,pcVar14,
                   program_00,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &validators_2.
                    super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                    *)&variableFilter_1.m_storageBits);
        std::
        vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
        ::~vector((vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                   *)&variableFilter_1.m_storageBits);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &validators_2.
                    super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        tcu::ScopedLogSection::~ScopedLogSection(&local_1140);
        std::__cxx11::string::~string((string *)local_1130);
      }
      break;
    case PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING:
      anon_unknown_0::TransformFeedbackTypeValidator::TransformFeedbackTypeValidator
                ((TransformFeedbackTypeValidator *)
                 &arraySizeValidator_3.super_TransformFeedbackResourceValidator.super_PropValidator.
                  m_validationProp,(this->super_TestCase).m_context);
      anon_unknown_0::TransformFeedbackArraySizeValidator::TransformFeedbackArraySizeValidator
                ((TransformFeedbackArraySizeValidator *)
                 &nameLengthValidator_4.super_TransformFeedbackResourceValidator.super_PropValidator
                  .m_validationProp,(this->super_TestCase).m_context);
      anon_unknown_0::TransformFeedbackNameLengthValidator::TransformFeedbackNameLengthValidator
                ((TransformFeedbackNameLengthValidator *)local_17e0,(this->super_TestCase).m_context
                );
      local_1818 = 0x92fb;
      allProperties_4[0]._0_8_ =
           &nameLengthValidator_4.super_TransformFeedbackResourceValidator.super_PropValidator.
            m_validationProp;
      allProperties_4[0].validator._0_4_ = 0x92f9;
      allProperties_4[1]._0_8_ = local_17e0;
      allProperties_4[1].validator._0_4_ = 0x92fa;
      allProperties_4[2]._0_8_ =
           &arraySizeValidator_3.super_TransformFeedbackResourceValidator.super_PropValidator.
            m_validationProp;
      for (section_5.m_log._4_4_ = 0; iVar6 = section_5.m_log._4_4_,
          sVar11 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&program.m_program.m_info.linkTimeUs), iVar6 < (int)sVar11;
          section_5.m_log._4_4_ = section_5.m_log._4_4_ + 1) {
        pTVar9 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1848,"XFBVariableResource",&local_1849);
        pvVar13 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&program.m_program.m_info.linkTimeUs,(long)section_5.m_log._4_4_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gl_4,
                       "Transform feedback varying \"",pvVar13);
        std::operator+(&local_1870,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gl_4,
                       "\"");
        tcu::ScopedLogSection::ScopedLogSection(&local_1828,pTVar9,&local_1848,&local_1870);
        std::__cxx11::string::~string((string *)&local_1870);
        std::__cxx11::string::~string((string *)&gl_4);
        std::__cxx11::string::~string((string *)&local_1848);
        std::allocator<char>::~allocator(&local_1849);
        pRVar8 = Context::getRenderContext((this->super_TestCase).m_context);
        iVar6 = (*pRVar8->_vptr_RenderContext[3])();
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &validators_4.
                    super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
        ::vector((vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                  *)local_18c8);
        for (local_18cc = 0; local_18cc < 3; local_18cc = local_18cc + 1) {
          bVar5 = anon_unknown_0::PropValidator::isSelected
                            (*(PropValidator **)(allProperties_4 + local_18cc),
                             (this->m_queryTarget).propFlags);
          if ((bVar5) &&
             (bVar5 = anon_unknown_0::PropValidator::isSupported
                                (*(PropValidator **)(allProperties_4 + local_18cc)), bVar5)) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       &validators_4.
                        super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       &local_1818 + (long)local_18cc * 4);
            std::
            vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
            ::push_back((vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                         *)local_18c8,(value_type *)(allProperties_4 + local_18cc));
          }
        }
        pTVar3 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
        dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_100);
        PVar1 = (this->m_queryTarget).interface;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&program.m_program.m_info.linkTimeUs,(long)section_5.m_log._4_4_);
        pcVar14 = (char *)std::__cxx11::string::c_str();
        queryAndValidateProps
                  (pTVar3,(Functions *)CONCAT44(extraout_var_04,iVar6),dVar7,PVar1,pcVar14,
                   program_00,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &validators_4.
                    super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                    *)local_18c8);
        std::
        vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
        ::~vector((vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                   *)local_18c8);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &validators_4.
                    super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        tcu::ScopedLogSection::~ScopedLogSection(&local_1828);
      }
      break;
    case PROGRAMINTERFACE_BUFFER_VARIABLE:
      register0x00000000 =
           ProgramInterfaceDefinition::VariableSearchFilter::createStorageFilter(STORAGE_BUFFER);
      pCVar2 = (this->super_TestCase).m_context;
      dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_100);
      anon_unknown_0::TypeValidator::TypeValidator
                ((TypeValidator *)&arraySizeValidator_2.m_unsizedArraySize,pCVar2,dVar7,
                 (VariableSearchFilter *)&typeValidator_2.super_SingleVariableValidator.m_programID)
      ;
      pCVar2 = (this->super_TestCase).m_context;
      dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_100);
      anon_unknown_0::ArraySizeValidator::ArraySizeValidator
                ((ArraySizeValidator *)
                 &arrayStrideValidator_1.super_SingleVariableValidator.field_0x30,pCVar2,dVar7,0,
                 (VariableSearchFilter *)&typeValidator_2.super_SingleVariableValidator.m_programID)
      ;
      pCVar2 = (this->super_TestCase).m_context;
      dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_100);
      anon_unknown_0::ArrayStrideValidator::ArrayStrideValidator
                ((ArrayStrideValidator *)
                 &blockIndexValidator_1.super_SingleVariableValidator.field_0x30,pCVar2,dVar7,
                 (VariableSearchFilter *)&typeValidator_2.super_SingleVariableValidator.m_programID)
      ;
      pCVar2 = (this->super_TestCase).m_context;
      dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_100);
      anon_unknown_0::BlockIndexValidator::BlockIndexValidator
                ((BlockIndexValidator *)
                 &isRowMajorValidator_1.super_SingleVariableValidator.field_0x30,pCVar2,dVar7,
                 (VariableSearchFilter *)&typeValidator_2.super_SingleVariableValidator.m_programID)
      ;
      pCVar2 = (this->super_TestCase).m_context;
      dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_100);
      anon_unknown_0::IsRowMajorValidator::IsRowMajorValidator
                ((IsRowMajorValidator *)
                 &matrixStrideValidator_1.super_SingleVariableValidator.field_0x30,pCVar2,dVar7,
                 (VariableSearchFilter *)&typeValidator_2.super_SingleVariableValidator.m_programID)
      ;
      pCVar2 = (this->super_TestCase).m_context;
      dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_100);
      anon_unknown_0::MatrixStrideValidator::MatrixStrideValidator
                ((MatrixStrideValidator *)&offsetValidator.super_SingleVariableValidator.field_0x30,
                 pCVar2,dVar7,
                 (VariableSearchFilter *)&typeValidator_2.super_SingleVariableValidator.m_programID)
      ;
      pCVar2 = (this->super_TestCase).m_context;
      dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_100);
      anon_unknown_0::OffsetValidator::OffsetValidator
                ((OffsetValidator *)&nameLengthValidator_3.super_SingleVariableValidator.field_0x30,
                 pCVar2,dVar7,
                 (VariableSearchFilter *)&typeValidator_2.super_SingleVariableValidator.m_programID)
      ;
      pCVar2 = (this->super_TestCase).m_context;
      dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_100);
      anon_unknown_0::VariableNameLengthValidator::VariableNameLengthValidator
                ((VariableNameLengthValidator *)&referencedByVertexVerifier_3.field_0x30,pCVar2,
                 dVar7,(VariableSearchFilter *)
                       &typeValidator_2.super_SingleVariableValidator.m_programID);
      anon_unknown_0::VariableReferencedByShaderValidator::VariableReferencedByShaderValidator
                ((VariableReferencedByShaderValidator *)&referencedByFragmentVerifier_3.field_0x30,
                 (this->super_TestCase).m_context,SHADERTYPE_VERTEX,
                 (VariableSearchFilter *)&typeValidator_2.super_SingleVariableValidator.m_programID)
      ;
      anon_unknown_0::VariableReferencedByShaderValidator::VariableReferencedByShaderValidator
                ((VariableReferencedByShaderValidator *)&referencedByComputeVerifier_3.field_0x30,
                 (this->super_TestCase).m_context,SHADERTYPE_FRAGMENT,
                 (VariableSearchFilter *)&typeValidator_2.super_SingleVariableValidator.m_programID)
      ;
      anon_unknown_0::VariableReferencedByShaderValidator::VariableReferencedByShaderValidator
                ((VariableReferencedByShaderValidator *)&referencedByGeometryVerifier_3.field_0x30,
                 (this->super_TestCase).m_context,SHADERTYPE_COMPUTE,
                 (VariableSearchFilter *)&typeValidator_2.super_SingleVariableValidator.m_programID)
      ;
      anon_unknown_0::VariableReferencedByShaderValidator::VariableReferencedByShaderValidator
                ((VariableReferencedByShaderValidator *)
                 &referencedByTessControlVerifier_3.field_0x30,(this->super_TestCase).m_context,
                 SHADERTYPE_GEOMETRY,
                 (VariableSearchFilter *)&typeValidator_2.super_SingleVariableValidator.m_programID)
      ;
      anon_unknown_0::VariableReferencedByShaderValidator::VariableReferencedByShaderValidator
                ((VariableReferencedByShaderValidator *)
                 &referencedByTessEvaluationVerifier_3.field_0x30,(this->super_TestCase).m_context,
                 SHADERTYPE_TESSELLATION_CONTROL,
                 (VariableSearchFilter *)&typeValidator_2.super_SingleVariableValidator.m_programID)
      ;
      anon_unknown_0::VariableReferencedByShaderValidator::VariableReferencedByShaderValidator
                ((VariableReferencedByShaderValidator *)
                 &topLevelArraySizeValidator.super_SingleVariableValidator.field_0x30,
                 (this->super_TestCase).m_context,SHADERTYPE_TESSELLATION_EVALUATION,
                 (VariableSearchFilter *)&typeValidator_2.super_SingleVariableValidator.m_programID)
      ;
      pCVar2 = (this->super_TestCase).m_context;
      dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_100);
      anon_unknown_0::TopLevelArraySizeValidator::TopLevelArraySizeValidator
                ((TopLevelArraySizeValidator *)
                 &topLevelArrayStrideValidator.super_SingleVariableValidator.field_0x30,pCVar2,dVar7
                 ,(VariableSearchFilter *)&typeValidator_2.super_SingleVariableValidator.m_programID
                );
      pCVar2 = (this->super_TestCase).m_context;
      dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_100);
      anon_unknown_0::TopLevelArrayStrideValidator::TopLevelArrayStrideValidator
                ((TopLevelArrayStrideValidator *)&allProperties_3[0xf].validator,pCVar2,dVar7,
                 (VariableSearchFilter *)&typeValidator_2.super_SingleVariableValidator.m_programID)
      ;
      local_1698 = 0x92fb;
      allProperties_3[0]._0_8_ = &arrayStrideValidator_1.super_SingleVariableValidator.field_0x30;
      allProperties_3[0].validator._0_4_ = 0x92fe;
      allProperties_3[1]._0_8_ = &blockIndexValidator_1.super_SingleVariableValidator.field_0x30;
      allProperties_3[1].validator._0_4_ = 0x92fd;
      allProperties_3[2]._0_8_ = &isRowMajorValidator_1.super_SingleVariableValidator.field_0x30;
      allProperties_3[2].validator._0_4_ = 0x9300;
      allProperties_3[3]._0_8_ = &matrixStrideValidator_1.super_SingleVariableValidator.field_0x30;
      allProperties_3[3].validator._0_4_ = 0x92ff;
      allProperties_3[4]._0_8_ = &offsetValidator.super_SingleVariableValidator.field_0x30;
      allProperties_3[4].validator._0_4_ = 0x92f9;
      allProperties_3[5]._0_8_ = &referencedByVertexVerifier_3.field_0x30;
      allProperties_3[5].validator._0_4_ = 0x92fc;
      allProperties_3[6]._0_8_ = &nameLengthValidator_3.super_SingleVariableValidator.field_0x30;
      allProperties_3[6].validator._0_4_ = 0x9306;
      allProperties_3[7]._0_8_ = &referencedByFragmentVerifier_3.field_0x30;
      allProperties_3[7].validator._0_4_ = 0x930a;
      allProperties_3[8]._0_8_ = &referencedByComputeVerifier_3.field_0x30;
      allProperties_3[8].validator._0_4_ = 0x930b;
      allProperties_3[9]._0_8_ = &referencedByGeometryVerifier_3.field_0x30;
      allProperties_3[9].validator._0_4_ = 0x9309;
      allProperties_3[10]._0_8_ = &referencedByTessControlVerifier_3.field_0x30;
      allProperties_3[10].validator._0_4_ = 0x9307;
      allProperties_3[0xb]._0_8_ = &referencedByTessEvaluationVerifier_3.field_0x30;
      allProperties_3[0xb].validator._0_4_ = 0x9308;
      allProperties_3[0xc]._0_8_ =
           &topLevelArraySizeValidator.super_SingleVariableValidator.field_0x30;
      allProperties_3[0xc].validator._0_4_ = 0x930c;
      allProperties_3[0xd]._0_8_ =
           &topLevelArrayStrideValidator.super_SingleVariableValidator.field_0x30;
      allProperties_3[0xd].validator._0_4_ = 0x930d;
      allProperties_3[0xe]._0_8_ = &allProperties_3[0xf].validator;
      allProperties_3[0xe].validator._0_4_ = 0x92fa;
      allProperties_3[0xf]._0_8_ = &arraySizeValidator_2.m_unsizedArraySize;
      for (section_4.m_log._4_4_ = 0; iVar6 = section_4.m_log._4_4_,
          sVar11 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&program.m_program.m_info.linkTimeUs), iVar6 < (int)sVar11;
          section_4.m_log._4_4_ = section_4.m_log._4_4_ + 1) {
        pTVar9 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_16c8,"BufferVariableResource",&local_16c9);
        pvVar13 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&program.m_program.m_info.linkTimeUs,(long)section_4.m_log._4_4_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gl_3,
                       "Buffer variable \"",pvVar13);
        std::operator+(&local_16f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gl_3,
                       "\"");
        tcu::ScopedLogSection::ScopedLogSection(&local_16a8,pTVar9,&local_16c8,&local_16f0);
        std::__cxx11::string::~string((string *)&local_16f0);
        std::__cxx11::string::~string((string *)&gl_3);
        std::__cxx11::string::~string((string *)&local_16c8);
        std::allocator<char>::~allocator(&local_16c9);
        pRVar8 = Context::getRenderContext((this->super_TestCase).m_context);
        iVar6 = (*pRVar8->_vptr_RenderContext[3])();
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &validators_3.
                    super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
        ::vector((vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                  *)local_1748);
        for (typeValidator_3.super_TransformFeedbackResourceValidator.super_PropValidator._44_4_ = 0
            ; (int)typeValidator_3.super_TransformFeedbackResourceValidator.super_PropValidator.
                   _44_4_ < 0x10;
            typeValidator_3.super_TransformFeedbackResourceValidator.super_PropValidator._44_4_ =
                 typeValidator_3.super_TransformFeedbackResourceValidator.super_PropValidator._44_4_
                 + 1) {
          bVar5 = anon_unknown_0::PropValidator::isSelected
                            (*(PropValidator **)
                              (allProperties_3 +
                              (int)typeValidator_3.super_TransformFeedbackResourceValidator.
                                   super_PropValidator._44_4_),(this->m_queryTarget).propFlags);
          if ((bVar5) &&
             (bVar5 = anon_unknown_0::PropValidator::isSupported
                                (*(PropValidator **)
                                  (allProperties_3 +
                                  (int)typeValidator_3.super_TransformFeedbackResourceValidator.
                                       super_PropValidator._44_4_)), bVar5)) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       &validators_3.
                        super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       &local_1698 +
                       (long)(int)typeValidator_3.super_TransformFeedbackResourceValidator.
                                  super_PropValidator._44_4_ * 4);
            std::
            vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
            ::push_back((vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                         *)local_1748,
                        (value_type *)
                        (allProperties_3 +
                        (int)typeValidator_3.super_TransformFeedbackResourceValidator.
                             super_PropValidator._44_4_));
          }
        }
        pTVar3 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
        dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_100);
        PVar1 = (this->m_queryTarget).interface;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&program.m_program.m_info.linkTimeUs,(long)section_4.m_log._4_4_);
        pcVar14 = (char *)std::__cxx11::string::c_str();
        queryAndValidateProps
                  (pTVar3,(Functions *)CONCAT44(extraout_var_03,iVar6),dVar7,PVar1,pcVar14,
                   program_00,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &validators_3.
                    super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                    *)local_1748);
        std::
        vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
        ::~vector((vector<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                   *)local_1748);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &validators_3.
                    super__Vector_base<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*,_std::allocator<const_deqp::gles31::Functional::(anonymous_namespace)::PropValidator_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        tcu::ScopedLogSection::~ScopedLogSection(&local_16a8);
      }
    }
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_100);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&program.m_program.m_info.linkTimeUs);
    return STOP;
  }
  pTVar9 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_540,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar12 = tcu::MessageBuilder::operator<<
                      (&local_540,
                       (char (*) [73])
                       "Program build failed, checking if program exceeded implementation limits");
  tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_540);
  pRVar8 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar6 = (*pRVar8->_vptr_RenderContext[3])();
  pTVar9 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  checkProgramResourceUsage(program_00,(Functions *)CONCAT44(extraout_var,iVar6),pTVar9);
  uniformFilter.m_shaderTypeBits._2_1_ = 1;
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&uniformFilter.m_storageBits,"could not build program",
             (allocator<char> *)((long)&uniformFilter.m_shaderTypeBits + 3));
  tcu::TestError::TestError(this_00,(string *)&uniformFilter.m_storageBits);
  uniformFilter.m_shaderTypeBits._2_1_ = 0;
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

ProgramInterfaceQueryTestCase::IterateResult ProgramInterfaceQueryTestCase::iterate (void)
{
	struct TestProperty
	{
		glw::GLenum				prop;
		const PropValidator*	validator;
	};

	const ProgramInterfaceDefinition::Program*	programDefinition	= getAndCheckProgramDefinition();
	const std::vector<std::string>				targetResources		= getQueryTargetResources();
	glu::ShaderProgram							program				(m_context.getRenderContext(), generateProgramInterfaceProgramSources(programDefinition));

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	// Log program
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Program", "Program");

		// Feedback varyings
		if (!programDefinition->getTransformFeedbackVaryings().empty())
		{
			tcu::MessageBuilder builder(&m_testCtx.getLog());
			builder << "Transform feedback varyings: {";
			for (int ndx = 0; ndx < (int)programDefinition->getTransformFeedbackVaryings().size(); ++ndx)
			{
				if (ndx)
					builder << ", ";
				builder << "\"" << programDefinition->getTransformFeedbackVaryings()[ndx] << "\"";
			}
			builder << "}" << tcu::TestLog::EndMessage;
		}

		m_testCtx.getLog() << program;
		if (!program.isOk())
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Program build failed, checking if program exceeded implementation limits" << tcu::TestLog::EndMessage;
			checkProgramResourceUsage(programDefinition, m_context.getRenderContext().getFunctions(), m_testCtx.getLog());

			// within limits
			throw tcu::TestError("could not build program");
		}
	}

	// Check interface props

	switch (m_queryTarget.interface)
	{
		case PROGRAMINTERFACE_UNIFORM:
		{
			const VariableSearchFilter					uniformFilter						= VariableSearchFilter::createStorageFilter(glu::STORAGE_UNIFORM);

			const TypeValidator							typeValidator						(m_context, program.getProgram(),						uniformFilter);
			const ArraySizeValidator					arraySizeValidator					(m_context, program.getProgram(),						-1,					uniformFilter);
			const ArrayStrideValidator					arrayStrideValidator				(m_context, program.getProgram(),						uniformFilter);
			const BlockIndexValidator					blockIndexValidator					(m_context, program.getProgram(),						uniformFilter);
			const IsRowMajorValidator					isRowMajorValidator					(m_context, program.getProgram(),						uniformFilter);
			const MatrixStrideValidator					matrixStrideValidator				(m_context, program.getProgram(),						uniformFilter);
			const AtomicCounterBufferIndexVerifier		atomicCounterBufferIndexVerifier	(m_context, program.getProgram(),						uniformFilter);
			const LocationValidator						locationValidator					(m_context, program.getProgram(),						uniformFilter);
			const VariableNameLengthValidator			nameLengthValidator					(m_context, program.getProgram(),						uniformFilter);
			const OffsetValidator						offsetVerifier						(m_context, program.getProgram(),						uniformFilter);
			const VariableReferencedByShaderValidator	referencedByVertexVerifier			(m_context, glu::SHADERTYPE_VERTEX,						uniformFilter);
			const VariableReferencedByShaderValidator	referencedByFragmentVerifier		(m_context, glu::SHADERTYPE_FRAGMENT,					uniformFilter);
			const VariableReferencedByShaderValidator	referencedByComputeVerifier			(m_context, glu::SHADERTYPE_COMPUTE,					uniformFilter);
			const VariableReferencedByShaderValidator	referencedByGeometryVerifier		(m_context, glu::SHADERTYPE_GEOMETRY,					uniformFilter);
			const VariableReferencedByShaderValidator	referencedByTessControlVerifier		(m_context, glu::SHADERTYPE_TESSELLATION_CONTROL,		uniformFilter);
			const VariableReferencedByShaderValidator	referencedByTessEvaluationVerifier	(m_context, glu::SHADERTYPE_TESSELLATION_EVALUATION,	uniformFilter);

			const TestProperty allProperties[] =
			{
				{ GL_ARRAY_SIZE,							&arraySizeValidator					},
				{ GL_ARRAY_STRIDE,							&arrayStrideValidator				},
				{ GL_ATOMIC_COUNTER_BUFFER_INDEX,			&atomicCounterBufferIndexVerifier	},
				{ GL_BLOCK_INDEX,							&blockIndexValidator				},
				{ GL_IS_ROW_MAJOR,							&isRowMajorValidator				},
				{ GL_LOCATION,								&locationValidator					},
				{ GL_MATRIX_STRIDE,							&matrixStrideValidator				},
				{ GL_NAME_LENGTH,							&nameLengthValidator				},
				{ GL_OFFSET,								&offsetVerifier						},
				{ GL_REFERENCED_BY_VERTEX_SHADER,			&referencedByVertexVerifier			},
				{ GL_REFERENCED_BY_FRAGMENT_SHADER,			&referencedByFragmentVerifier		},
				{ GL_REFERENCED_BY_COMPUTE_SHADER,			&referencedByComputeVerifier		},
				{ GL_REFERENCED_BY_GEOMETRY_SHADER,			&referencedByGeometryVerifier		},
				{ GL_REFERENCED_BY_TESS_CONTROL_SHADER,		&referencedByTessControlVerifier	},
				{ GL_REFERENCED_BY_TESS_EVALUATION_SHADER,	&referencedByTessEvaluationVerifier	},
				{ GL_TYPE,									&typeValidator						},
			};

			for (int targetResourceNdx = 0; targetResourceNdx < (int)targetResources.size(); ++targetResourceNdx)
			{
				const tcu::ScopedLogSection			section			(m_testCtx.getLog(), "UniformResource", "Uniform resource \"" +  targetResources[targetResourceNdx] + "\"");
				const glw::Functions&				gl				= m_context.getRenderContext().getFunctions();
				std::vector<glw::GLenum>			props;
				std::vector<const PropValidator*>	validators;

				for (int propNdx = 0; propNdx < DE_LENGTH_OF_ARRAY(allProperties); ++propNdx)
				{
					if (allProperties[propNdx].validator->isSelected(m_queryTarget.propFlags) &&
						allProperties[propNdx].validator->isSupported())
					{
						props.push_back(allProperties[propNdx].prop);
						validators.push_back(allProperties[propNdx].validator);
					}
				}

				DE_ASSERT(!props.empty());

				queryAndValidateProps(m_testCtx, gl, program.getProgram(), m_queryTarget.interface, targetResources[targetResourceNdx].c_str(), programDefinition, props, validators);
			}

			break;
		}

		case PROGRAMINTERFACE_UNIFORM_BLOCK:
		case PROGRAMINTERFACE_SHADER_STORAGE_BLOCK:
		{
			const glu::Storage						storage								= (m_queryTarget.interface == PROGRAMINTERFACE_UNIFORM_BLOCK) ? (glu::STORAGE_UNIFORM) : (glu::STORAGE_BUFFER);
			const VariableSearchFilter				blockFilter							= VariableSearchFilter::createStorageFilter(storage);

			const BlockNameLengthValidator			nameLengthValidator					(m_context, program.getProgram(),						blockFilter);
			const BlockReferencedByShaderValidator	referencedByVertexVerifier			(m_context, glu::SHADERTYPE_VERTEX,						blockFilter);
			const BlockReferencedByShaderValidator	referencedByFragmentVerifier		(m_context, glu::SHADERTYPE_FRAGMENT,					blockFilter);
			const BlockReferencedByShaderValidator	referencedByComputeVerifier			(m_context, glu::SHADERTYPE_COMPUTE,					blockFilter);
			const BlockReferencedByShaderValidator	referencedByGeometryVerifier		(m_context, glu::SHADERTYPE_GEOMETRY,					blockFilter);
			const BlockReferencedByShaderValidator	referencedByTessControlVerifier		(m_context, glu::SHADERTYPE_TESSELLATION_CONTROL,		blockFilter);
			const BlockReferencedByShaderValidator	referencedByTessEvaluationVerifier	(m_context, glu::SHADERTYPE_TESSELLATION_EVALUATION,	blockFilter);
			const BufferBindingValidator			bufferBindingValidator				(m_context, program.getProgram(),						blockFilter);

			const TestProperty allProperties[] =
			{
				{ GL_NAME_LENGTH,							&nameLengthValidator				},
				{ GL_REFERENCED_BY_VERTEX_SHADER,			&referencedByVertexVerifier			},
				{ GL_REFERENCED_BY_FRAGMENT_SHADER,			&referencedByFragmentVerifier		},
				{ GL_REFERENCED_BY_COMPUTE_SHADER,			&referencedByComputeVerifier		},
				{ GL_REFERENCED_BY_GEOMETRY_SHADER,			&referencedByGeometryVerifier		},
				{ GL_REFERENCED_BY_TESS_CONTROL_SHADER,		&referencedByTessControlVerifier	},
				{ GL_REFERENCED_BY_TESS_EVALUATION_SHADER,	&referencedByTessEvaluationVerifier	},
				{ GL_BUFFER_BINDING,						&bufferBindingValidator				},
			};

			for (int targetResourceNdx = 0; targetResourceNdx < (int)targetResources.size(); ++targetResourceNdx)
			{
				const tcu::ScopedLogSection			section			(m_testCtx.getLog(), "BlockResource", "Interface block \"" +  targetResources[targetResourceNdx] + "\"");
				const glw::Functions&				gl				= m_context.getRenderContext().getFunctions();
				std::vector<glw::GLenum>			props;
				std::vector<const PropValidator*>	validators;

				for (int propNdx = 0; propNdx < DE_LENGTH_OF_ARRAY(allProperties); ++propNdx)
				{
					if (allProperties[propNdx].validator->isSelected(m_queryTarget.propFlags) &&
						allProperties[propNdx].validator->isSupported())
					{
						props.push_back(allProperties[propNdx].prop);
						validators.push_back(allProperties[propNdx].validator);
					}
				}

				DE_ASSERT(!props.empty());

				queryAndValidateProps(m_testCtx, gl, program.getProgram(), m_queryTarget.interface, targetResources[targetResourceNdx].c_str(), programDefinition, props, validators);
			}

			break;
		}

		case PROGRAMINTERFACE_PROGRAM_INPUT:
		case PROGRAMINTERFACE_PROGRAM_OUTPUT:
		{
			const bool									isInputCase							= (m_queryTarget.interface == PROGRAMINTERFACE_PROGRAM_INPUT);
			const glu::Storage							varyingStorage						= (isInputCase) ? (glu::STORAGE_IN) : (glu::STORAGE_OUT);
			const glu::Storage							patchStorage						= (isInputCase) ? (glu::STORAGE_PATCH_IN) : (glu::STORAGE_PATCH_OUT);
			const glu::ShaderType						shaderType							= (isInputCase) ? (programDefinition->getFirstStage()) : (programDefinition->getLastStage());
			const int									unsizedArraySize					= (isInputCase && shaderType == glu::SHADERTYPE_GEOMETRY)					? (1)															// input points
																							: (isInputCase && shaderType == glu::SHADERTYPE_TESSELLATION_CONTROL)		? (getMaxPatchVertices())										// input batch size
																							: (!isInputCase && shaderType == glu::SHADERTYPE_TESSELLATION_CONTROL)		? (programDefinition->getTessellationNumOutputPatchVertices())	// output batch size
																							: (isInputCase && shaderType == glu::SHADERTYPE_TESSELLATION_EVALUATION)	? (getMaxPatchVertices())										// input batch size
																							: (-1);
			const VariableSearchFilter					variableFilter						= VariableSearchFilter::logicalAnd(VariableSearchFilter::createShaderTypeFilter(shaderType),
																															   VariableSearchFilter::logicalOr(VariableSearchFilter::createStorageFilter(varyingStorage),
																																							   VariableSearchFilter::createStorageFilter(patchStorage)));

			const TypeValidator							typeValidator						(m_context, program.getProgram(),						variableFilter);
			const ArraySizeValidator					arraySizeValidator					(m_context, program.getProgram(),						unsizedArraySize,		variableFilter);
			const LocationValidator						locationValidator					(m_context, program.getProgram(),						variableFilter);
			const VariableNameLengthValidator			nameLengthValidator					(m_context, program.getProgram(),						variableFilter);
			const VariableReferencedByShaderValidator	referencedByVertexVerifier			(m_context, glu::SHADERTYPE_VERTEX,						variableFilter);
			const VariableReferencedByShaderValidator	referencedByFragmentVerifier		(m_context, glu::SHADERTYPE_FRAGMENT,					variableFilter);
			const VariableReferencedByShaderValidator	referencedByComputeVerifier			(m_context, glu::SHADERTYPE_COMPUTE,					variableFilter);
			const VariableReferencedByShaderValidator	referencedByGeometryVerifier		(m_context, glu::SHADERTYPE_GEOMETRY,					variableFilter);
			const VariableReferencedByShaderValidator	referencedByTessControlVerifier		(m_context, glu::SHADERTYPE_TESSELLATION_CONTROL,		variableFilter);
			const VariableReferencedByShaderValidator	referencedByTessEvaluationVerifier	(m_context, glu::SHADERTYPE_TESSELLATION_EVALUATION,	variableFilter);
			const PerPatchValidator						perPatchValidator					(m_context, program.getProgram(),						variableFilter);

			const TestProperty allProperties[] =
			{
				{ GL_ARRAY_SIZE,							&arraySizeValidator					},
				{ GL_LOCATION,								&locationValidator					},
				{ GL_NAME_LENGTH,							&nameLengthValidator				},
				{ GL_REFERENCED_BY_VERTEX_SHADER,			&referencedByVertexVerifier			},
				{ GL_REFERENCED_BY_FRAGMENT_SHADER,			&referencedByFragmentVerifier		},
				{ GL_REFERENCED_BY_COMPUTE_SHADER,			&referencedByComputeVerifier		},
				{ GL_REFERENCED_BY_GEOMETRY_SHADER,			&referencedByGeometryVerifier		},
				{ GL_REFERENCED_BY_TESS_CONTROL_SHADER,		&referencedByTessControlVerifier	},
				{ GL_REFERENCED_BY_TESS_EVALUATION_SHADER,	&referencedByTessEvaluationVerifier	},
				{ GL_TYPE,									&typeValidator						},
				{ GL_IS_PER_PATCH,							&perPatchValidator					},
			};

			for (int targetResourceNdx = 0; targetResourceNdx < (int)targetResources.size(); ++targetResourceNdx)
			{
				const std::string					resourceInterfaceName	= (m_queryTarget.interface == PROGRAMINTERFACE_PROGRAM_INPUT) ? ("Input") : ("Output");
				const tcu::ScopedLogSection			section					(m_testCtx.getLog(), "BlockResource", resourceInterfaceName + " resource \"" +  targetResources[targetResourceNdx] + "\"");
				const glw::Functions&				gl						= m_context.getRenderContext().getFunctions();
				std::vector<glw::GLenum>			props;
				std::vector<const PropValidator*>	validators;

				for (int propNdx = 0; propNdx < DE_LENGTH_OF_ARRAY(allProperties); ++propNdx)
				{
					if (allProperties[propNdx].validator->isSelected(m_queryTarget.propFlags) &&
						allProperties[propNdx].validator->isSupported())
					{
						props.push_back(allProperties[propNdx].prop);
						validators.push_back(allProperties[propNdx].validator);
					}
				}

				DE_ASSERT(!props.empty());

				queryAndValidateProps(m_testCtx, gl, program.getProgram(), m_queryTarget.interface, targetResources[targetResourceNdx].c_str(), programDefinition, props, validators);
			}

			break;
		}

		case PROGRAMINTERFACE_BUFFER_VARIABLE:
		{
			const VariableSearchFilter					variableFilter						= VariableSearchFilter::createStorageFilter(glu::STORAGE_BUFFER);

			const TypeValidator							typeValidator						(m_context, program.getProgram(),						variableFilter);
			const ArraySizeValidator					arraySizeValidator					(m_context, program.getProgram(),						0,					variableFilter);
			const ArrayStrideValidator					arrayStrideValidator				(m_context, program.getProgram(),						variableFilter);
			const BlockIndexValidator					blockIndexValidator					(m_context, program.getProgram(),						variableFilter);
			const IsRowMajorValidator					isRowMajorValidator					(m_context, program.getProgram(),						variableFilter);
			const MatrixStrideValidator					matrixStrideValidator				(m_context, program.getProgram(),						variableFilter);
			const OffsetValidator						offsetValidator						(m_context, program.getProgram(),						variableFilter);
			const VariableNameLengthValidator			nameLengthValidator					(m_context, program.getProgram(),						variableFilter);
			const VariableReferencedByShaderValidator	referencedByVertexVerifier			(m_context, glu::SHADERTYPE_VERTEX,						variableFilter);
			const VariableReferencedByShaderValidator	referencedByFragmentVerifier		(m_context, glu::SHADERTYPE_FRAGMENT,					variableFilter);
			const VariableReferencedByShaderValidator	referencedByComputeVerifier			(m_context, glu::SHADERTYPE_COMPUTE,					variableFilter);
			const VariableReferencedByShaderValidator	referencedByGeometryVerifier		(m_context, glu::SHADERTYPE_GEOMETRY,					variableFilter);
			const VariableReferencedByShaderValidator	referencedByTessControlVerifier		(m_context, glu::SHADERTYPE_TESSELLATION_CONTROL,		variableFilter);
			const VariableReferencedByShaderValidator	referencedByTessEvaluationVerifier	(m_context, glu::SHADERTYPE_TESSELLATION_EVALUATION,	variableFilter);
			const TopLevelArraySizeValidator			topLevelArraySizeValidator			(m_context, program.getProgram(),						variableFilter);
			const TopLevelArrayStrideValidator			topLevelArrayStrideValidator		(m_context, program.getProgram(),						variableFilter);

			const TestProperty allProperties[] =
			{
				{ GL_ARRAY_SIZE,							&arraySizeValidator					},
				{ GL_ARRAY_STRIDE,							&arrayStrideValidator				},
				{ GL_BLOCK_INDEX,							&blockIndexValidator				},
				{ GL_IS_ROW_MAJOR,							&isRowMajorValidator				},
				{ GL_MATRIX_STRIDE,							&matrixStrideValidator				},
				{ GL_NAME_LENGTH,							&nameLengthValidator				},
				{ GL_OFFSET,								&offsetValidator					},
				{ GL_REFERENCED_BY_VERTEX_SHADER,			&referencedByVertexVerifier			},
				{ GL_REFERENCED_BY_FRAGMENT_SHADER,			&referencedByFragmentVerifier		},
				{ GL_REFERENCED_BY_COMPUTE_SHADER,			&referencedByComputeVerifier		},
				{ GL_REFERENCED_BY_GEOMETRY_SHADER,			&referencedByGeometryVerifier		},
				{ GL_REFERENCED_BY_TESS_CONTROL_SHADER,		&referencedByTessControlVerifier	},
				{ GL_REFERENCED_BY_TESS_EVALUATION_SHADER,	&referencedByTessEvaluationVerifier	},
				{ GL_TOP_LEVEL_ARRAY_SIZE,					&topLevelArraySizeValidator			},
				{ GL_TOP_LEVEL_ARRAY_STRIDE,				&topLevelArrayStrideValidator		},
				{ GL_TYPE,									&typeValidator						},
			};

			for (int targetResourceNdx = 0; targetResourceNdx < (int)targetResources.size(); ++targetResourceNdx)
			{
				const tcu::ScopedLogSection			section			(m_testCtx.getLog(), "BufferVariableResource", "Buffer variable \"" +  targetResources[targetResourceNdx] + "\"");
				const glw::Functions&				gl				= m_context.getRenderContext().getFunctions();
				std::vector<glw::GLenum>			props;
				std::vector<const PropValidator*>	validators;

				for (int propNdx = 0; propNdx < DE_LENGTH_OF_ARRAY(allProperties); ++propNdx)
				{
					if (allProperties[propNdx].validator->isSelected(m_queryTarget.propFlags) &&
						allProperties[propNdx].validator->isSupported())
					{
						props.push_back(allProperties[propNdx].prop);
						validators.push_back(allProperties[propNdx].validator);
					}
				}

				DE_ASSERT(!props.empty());

				queryAndValidateProps(m_testCtx, gl, program.getProgram(), m_queryTarget.interface, targetResources[targetResourceNdx].c_str(), programDefinition, props, validators);
			}

			break;
		}

		case PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING:
		{
			const TransformFeedbackTypeValidator		typeValidator			(m_context);
			const TransformFeedbackArraySizeValidator	arraySizeValidator		(m_context);
			const TransformFeedbackNameLengthValidator	nameLengthValidator		(m_context);

			const TestProperty allProperties[] =
			{
				{ GL_ARRAY_SIZE,					&arraySizeValidator				},
				{ GL_NAME_LENGTH,					&nameLengthValidator			},
				{ GL_TYPE,							&typeValidator					},
			};

			for (int targetResourceNdx = 0; targetResourceNdx < (int)targetResources.size(); ++targetResourceNdx)
			{
				const tcu::ScopedLogSection			section			(m_testCtx.getLog(), "XFBVariableResource", "Transform feedback varying \"" +  targetResources[targetResourceNdx] + "\"");
				const glw::Functions&				gl				= m_context.getRenderContext().getFunctions();
				std::vector<glw::GLenum>			props;
				std::vector<const PropValidator*>	validators;

				for (int propNdx = 0; propNdx < DE_LENGTH_OF_ARRAY(allProperties); ++propNdx)
				{
					if (allProperties[propNdx].validator->isSelected(m_queryTarget.propFlags) &&
						allProperties[propNdx].validator->isSupported())
					{
						props.push_back(allProperties[propNdx].prop);
						validators.push_back(allProperties[propNdx].validator);
					}
				}

				DE_ASSERT(!props.empty());

				queryAndValidateProps(m_testCtx, gl, program.getProgram(), m_queryTarget.interface, targetResources[targetResourceNdx].c_str(), programDefinition, props, validators);
			}

			break;
		}

		default:
			DE_ASSERT(false);
	}

	return STOP;
}